

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O2

string * __thiscall
Json::JsonParser::resolve_escape_hex_unicode_abi_cxx11_
          (string *__return_storage_ptr__,JsonParser *this)

{
  char value;
  int iVar1;
  bool bVar2;
  int unicodeC;
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  stringstream ss;
  long local_198 [3];
  uint auStack_180 [88];
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  iVar1 = 4;
  while( true ) {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
      std::operator<<((ostream *)local_198,(this->__buffer_value)._M_dataplus._M_p);
      std::istream::operator>>((istream *)&ss,&unicodeC);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::wstring_convert(&convert);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::to_bytes(__return_storage_ptr__,&convert,(char16_t)unicodeC);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::~wstring_convert(&convert);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return __return_storage_ptr__;
    }
    value = JsonReader::get(&this->__reader);
    if (0x36 < (byte)(value - 0x30U)) break;
    buffer_append(this,value);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::resolve_escape_hex_unicode() {
    buffer_reset();
    for (int i = 0; i < 4; i++) {
        char c = __reader.get();
        if (!is_hex(c)) return "";
        buffer_append(c);
    }
    std::stringstream ss;
    int unicodeC;
    ss << std::hex << buffer_str();
    ss >> unicodeC;
    std::wstring_convert<std::codecvt_utf8_utf16<char16_t>, char16_t> convert;
    return convert.to_bytes(unicodeC);
}